

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3RollbackAll(sqlite3 *db,int tripCode)

{
  byte *pbVar1;
  Btree *p;
  bool bVar2;
  int iVar3;
  Vdbe *pVVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  
  if (sqlite3Hooks_0 != (code *)0x0) {
    (*sqlite3Hooks_0)();
  }
  if (db->noSharedCache == '\0') {
    btreeEnterAll(db);
  }
  if ((db->mDbFlags & 1) == 0) {
    bVar7 = false;
  }
  else {
    bVar7 = (db->init).busy == '\0';
  }
  iVar3 = db->nDb;
  if (iVar3 < 1) {
    bVar2 = true;
  }
  else {
    lVar5 = 0;
    lVar6 = 8;
    bVar2 = false;
    do {
      p = *(Btree **)((long)&db->aDb->zDbSName + lVar6);
      if (p != (Btree *)0x0) {
        if (p->inTrans == '\x02') {
          bVar2 = true;
        }
        sqlite3BtreeRollback(p,tripCode,(uint)(bVar7 ^ 1));
        iVar3 = db->nDb;
      }
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x20;
    } while (lVar5 < iVar3);
    bVar2 = !bVar2;
  }
  callFinaliser(db,0x88);
  if (sqlite3Hooks_1 != (code *)0x0) {
    (*sqlite3Hooks_1)();
  }
  if (bVar7 != false) {
    for (pVVar4 = db->pVdbe; pVVar4 != (Vdbe *)0x0; pVVar4 = pVVar4->pNext) {
      *(ushort *)&pVVar4->field_0xc5 = (*(ushort *)&pVVar4->field_0xc5 & 0xfffc) + 1;
    }
    sqlite3ResetAllSchemasOfConnection(db);
  }
  if (db->noSharedCache == '\0') {
    btreeLeaveAll(db);
  }
  db->nDeferredCons = 0;
  db->nDeferredImmCons = 0;
  pbVar1 = (byte *)((long)&db->flags + 2);
  *pbVar1 = *pbVar1 & 0xf7;
  if ((db->xRollbackCallback != (_func_void_void_ptr *)0x0) &&
     ((!bVar2 || (db->autoCommit == '\0')))) {
    (*db->xRollbackCallback)(db->pRollbackArg);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3RollbackAll(sqlite3 *db, int tripCode){
  int i;
  int inTrans = 0;
  int schemaChange;
  assert( sqlite3_mutex_held(db->mutex) );
  sqlite3BeginBenignMalloc();

  /* Obtain all b-tree mutexes before making any calls to BtreeRollback(). 
  ** This is important in case the transaction being rolled back has
  ** modified the database schema. If the b-tree mutexes are not taken
  ** here, then another shared-cache connection might sneak in between
  ** the database rollback and schema reset, which can cause false
  ** corruption reports in some cases.  */
  sqlite3BtreeEnterAll(db);
  schemaChange = (db->mDbFlags & DBFLAG_SchemaChange)!=0 && db->init.busy==0;

  for(i=0; i<db->nDb; i++){
    Btree *p = db->aDb[i].pBt;
    if( p ){
      if( sqlite3BtreeIsInTrans(p) ){
        inTrans = 1;
      }
      sqlite3BtreeRollback(p, tripCode, !schemaChange);
    }
  }
  sqlite3VtabRollback(db);
  sqlite3EndBenignMalloc();

  if( schemaChange ){
    sqlite3ExpirePreparedStatements(db, 0);
    sqlite3ResetAllSchemasOfConnection(db);
  }
  sqlite3BtreeLeaveAll(db);

  /* Any deferred constraint violations have now been resolved. */
  db->nDeferredCons = 0;
  db->nDeferredImmCons = 0;
  db->flags &= ~(u64)SQLITE_DeferFKs;

  /* If one has been configured, invoke the rollback-hook callback */
  if( db->xRollbackCallback && (inTrans || !db->autoCommit) ){
    db->xRollbackCallback(db->pRollbackArg);
  }
}